

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_VelFromAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  char *__assertion;
  AActor *this;
  DAngle local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00436c97;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00436c97;
        }
        goto LAB_00436c37;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_00436c87;
    this = (AActor *)0x0;
LAB_00436c37:
    if (numparam == 1) {
      AActor::VelFromAngle(this);
    }
    else {
      if (param[1].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1de7,
                      "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (numparam == 2) {
        AActor::VelFromAngle(this,param[1].field_0.f);
      }
      else {
        if (param[2].field_0.field_3.Type != '\x01') {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1dee,
                        "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_20.Degrees = (double)param[2].field_0.field_1.a;
        AActor::VelFromAngle(this,param[1].field_0.f,&local_20);
      }
    }
    return 0;
  }
LAB_00436c87:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00436c97:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1de0,
                "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, VelFromAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (numparam == 1)
	{
		self->VelFromAngle();
	}
	else
	{
		PARAM_FLOAT(speed);
		if (numparam == 2)
		{
			self->VelFromAngle(speed);
		}
		else
		{
			PARAM_ANGLE(angle);
			self->VelFromAngle(speed, angle);
		}
	}
	return 0;
}